

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpixeltransferoptions.cpp
# Opt level: O2

void __thiscall
QOpenGLPixelTransferOptions::setSkipImages(QOpenGLPixelTransferOptions *this,int skipImages)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  
  pQVar1 = QSharedDataPointer<QOpenGLPixelTransferOptionsData>::operator->(&this->data);
  pQVar1->skipImages = skipImages;
  return;
}

Assistant:

void QOpenGLPixelTransferOptions::setSkipImages(int skipImages)
{
    data->skipImages = skipImages;
}